

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluObjectWrapper.cpp
# Opt level: O3

void __thiscall glu::ObjectVector::resize(ObjectVector *this,size_t newSize)

{
  pointer puVar1;
  ulong uVar2;
  ulong uVar3;
  value_type_conflict4 local_2c;
  
  puVar1 = (this->m_objects).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_start;
  uVar2 = (long)(this->m_objects).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
  uVar3 = (long)uVar2 >> 2;
  if (newSize == 0) {
    (**(code **)((long)&this->m_gl->activeShaderProgram + this->m_traits->deleteFunc))(uVar2 >> 2);
    puVar1 = (this->m_objects).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->m_objects).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish != puVar1) {
      (this->m_objects).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar1;
    }
  }
  if (uVar3 < newSize) {
    local_2c = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&this->m_objects,newSize,&local_2c);
    (**(code **)((long)&this->m_gl->activeShaderProgram + this->m_traits->genFunc))
              ((int)newSize - (int)uVar3,
               uVar2 + (long)(this->m_objects).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start);
  }
  else if (newSize < uVar3) {
    (**(code **)((long)&this->m_gl->activeShaderProgram + this->m_traits->deleteFunc))
              ((int)uVar3 - (int)newSize,puVar1 + newSize);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&this->m_objects,newSize);
    return;
  }
  return;
}

Assistant:

void ObjectVector::resize (size_t newSize)
{
	const size_t oldSize = m_objects.size();

	if (newSize == 0)
	{
		clear(); // Avoid size_t (unsigned) overflow issues in delete path.
	}
	if (oldSize < newSize)
	{
		m_objects.resize(newSize, 0);
		(m_gl.*m_traits.genFunc)(glw::GLsizei(newSize - oldSize), &m_objects[oldSize]);
	}
	else if (oldSize > newSize)
	{
		(m_gl.*m_traits.deleteFunc)(glw::GLsizei(oldSize - newSize), &m_objects[newSize]);
		m_objects.resize(newSize);
	}
}